

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

void __thiscall
TMap<int,_MapinfoEdMapItem,_THashTraits<int>,_TValueTraits<MapinfoEdMapItem>_>::Resize
          (TMap<int,_MapinfoEdMapItem,_THashTraits<int>,_TValueTraits<MapinfoEdMapItem>_> *this,
          hash_t nhsize)

{
  Node *block;
  undefined8 uVar1;
  char cVar2;
  undefined1 uVar3;
  int iVar4;
  Node *pNVar5;
  ulong uVar6;
  FString *other;
  
  uVar6 = (ulong)this->Size;
  block = this->Nodes;
  SetNodeVector(this,nhsize);
  this->NumUsed = 0;
  if (uVar6 != 0) {
    other = &(block->Pair).Value.filename;
    do {
      if (*(long *)(other + -6) != 1) {
        pNVar5 = NewKey(this,*(int *)(other + -5));
        (pNVar5->Pair).Value.classname.Index = (((MapinfoEdMapItem *)(other + -4))->classname).Index
        ;
        *(undefined8 *)((pNVar5->Pair).Value.args + 3) = *(undefined8 *)((long)(other + -2) + 4);
        cVar2 = *(char *)((long)&other[-4].Chars + 6);
        uVar3 = *(undefined1 *)((long)&other[-4].Chars + 7);
        iVar4 = *(int *)&other[-3].Chars;
        uVar1 = *(undefined8 *)((long)(other + -3) + 4);
        (pNVar5->Pair).Value.special = *(short *)((long)&other[-4].Chars + 4);
        (pNVar5->Pair).Value.argsdefined = cVar2;
        (pNVar5->Pair).Value.field_0x7 = uVar3;
        (pNVar5->Pair).Value.args[0] = iVar4;
        *(undefined8 *)((pNVar5->Pair).Value.args + 1) = uVar1;
        FString::AttachToOther(&(pNVar5->Pair).Value.filename,other);
        (pNVar5->Pair).Value.linenum = *(int *)(other + 1);
        FString::~FString(other);
      }
      other = other + 8;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  M_Free(block);
  return;
}

Assistant:

void Resize(hash_t nhsize)
	{
		hash_t i, oldhsize = Size;
		Node *nold = Nodes;
		/* create new hash part with appropriate size */
		SetNodeVector(nhsize);
		/* re-insert elements from hash part */
		NumUsed = 0;
		for (i = 0; i < oldhsize; ++i)
		{
			if (!nold[i].IsNil())
			{
				Node *n = NewKey(nold[i].Pair.Key);
				::new(&n->Pair.Value) VT(nold[i].Pair.Value);
				nold[i].~Node();
			}
		}
		M_Free(nold);
	}